

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

int Ga2_ManBreakTree_rec(Gia_Man_t *p,Gia_Obj_t *pObj,int fFirst,int N)

{
  Gia_Obj_t *pGVar1;
  int local_30;
  int local_2c;
  int Val1;
  int Val0;
  int N_local;
  int fFirst_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if ((*(long *)pObj < 0) && (fFirst == 0)) {
    p_local._4_4_ = 1;
  }
  else {
    pGVar1 = Gia_ObjFanin0(pObj);
    local_2c = Ga2_ManBreakTree_rec(p,pGVar1,0,N);
    pGVar1 = Gia_ObjFanin1(pObj);
    local_30 = Ga2_ManBreakTree_rec(p,pGVar1,0,N);
    if (local_2c + local_30 < N) {
      p_local._4_4_ = local_2c + local_30;
    }
    else if (local_2c + local_30 == N) {
      *(ulong *)pObj = *(ulong *)pObj & 0x7fffffffffffffff | 0x8000000000000000;
      p_local._4_4_ = 1;
    }
    else {
      if (local_2c + local_30 <= N) {
        __assert_fail("Val0 + Val1 > N",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                      ,0xbe,"int Ga2_ManBreakTree_rec(Gia_Man_t *, Gia_Obj_t *, int, int)");
      }
      if ((N <= local_2c) || (N <= local_30)) {
        __assert_fail("Val0 < N && Val1 < N",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                      ,0xbf,"int Ga2_ManBreakTree_rec(Gia_Man_t *, Gia_Obj_t *, int, int)");
      }
      if (local_2c < local_30) {
        pGVar1 = Gia_ObjFanin1(pObj);
        *(ulong *)pGVar1 = *(ulong *)pGVar1 & 0x7fffffffffffffff | 0x8000000000000000;
        local_30 = 1;
      }
      else {
        pGVar1 = Gia_ObjFanin0(pObj);
        *(ulong *)pGVar1 = *(ulong *)pGVar1 & 0x7fffffffffffffff | 0x8000000000000000;
        local_2c = 1;
      }
      if (local_2c + local_30 < N) {
        p_local._4_4_ = local_2c + local_30;
      }
      else {
        if (local_2c + local_30 != N) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                        ,0xd1,"int Ga2_ManBreakTree_rec(Gia_Man_t *, Gia_Obj_t *, int, int)");
        }
        *(ulong *)pObj = *(ulong *)pObj & 0x7fffffffffffffff | 0x8000000000000000;
        p_local._4_4_ = 1;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Ga2_ManBreakTree_rec( Gia_Man_t * p, Gia_Obj_t * pObj, int fFirst, int N )
{   // breaks a tree rooted at the node into N-feasible subtrees
    int Val0, Val1;
    if ( pObj->fPhase && !fFirst )
        return 1;
    Val0 = Ga2_ManBreakTree_rec( p, Gia_ObjFanin0(pObj), 0, N );
    Val1 = Ga2_ManBreakTree_rec( p, Gia_ObjFanin1(pObj), 0, N );
    if ( Val0 + Val1 < N )
        return Val0 + Val1;
    if ( Val0 + Val1 == N )
    {
        pObj->fPhase = 1;
        return 1;
    }
    assert( Val0 + Val1 > N );
    assert( Val0 < N && Val1 < N );
    if ( Val0 >= Val1 )
    {
        Gia_ObjFanin0(pObj)->fPhase = 1;
        Val0 = 1;
    }
    else 
    {
        Gia_ObjFanin1(pObj)->fPhase = 1;
        Val1 = 1;
    }
    if ( Val0 + Val1 < N )
        return Val0 + Val1;
    if ( Val0 + Val1 == N )
    {
        pObj->fPhase = 1;
        return 1;
    }
    assert( 0 );
    return -1;
}